

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode servercert(connectdata *conn,ssl_connect_data *connssl,_Bool strict)

{
  byte bVar1;
  Curl_easy *data_00;
  ssl_config_data *psVar2;
  int iVar3;
  BIO_METHOD *pBVar4;
  BIO *fp_00;
  BIO *a;
  ulong error;
  char *pcVar5;
  X509 *pXVar6;
  X509_NAME *pXVar7;
  ASN1_TIME *pAVar8;
  long lVar9;
  X509 *issuer_00;
  bool bVar10;
  long *local_a20;
  char *local_a08;
  char *local_9f8;
  char *local_9e8;
  char *local_9d8;
  char *local_9c8;
  char **local_9a8;
  long *local_980;
  long len;
  BIO *mem;
  long *certverifyresult;
  char *ptr;
  char buffer [2048];
  char error_buffer [256];
  BIO *fp;
  X509 *issuer;
  Curl_easy *data;
  long lerr;
  CURLcode local_28;
  int rc;
  CURLcode result;
  _Bool strict_local;
  ssl_connect_data *connssl_local;
  connectdata *conn_local;
  
  local_28 = CURLE_OK;
  data_00 = conn->data;
  memset(buffer + 0x7f8,0,0x100);
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    psVar2 = &(data_00->set).proxy_ssl;
  }
  else {
    psVar2 = &(data_00->set).ssl;
  }
  local_980 = &psVar2->certverifyresult;
  pBVar4 = BIO_s_mem();
  fp_00 = BIO_new(pBVar4);
  if (((data_00->set).ssl.certinfo & 1U) != 0) {
    get_cert_chain(conn,connssl);
  }
  pBVar4 = BIO_s_file();
  a = BIO_new(pBVar4);
  if (a == (BIO *)0x0) {
    error = ERR_get_error();
    pcVar5 = ossl_strerror(error,buffer + 0x7f8,0x100);
    Curl_failf(data_00,"BIO_new return NULL, OpenSSL error %s",pcVar5);
    BIO_free(fp_00);
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pXVar6 = (X509 *)SSL_get1_peer_certificate(connssl->backend->handle);
    connssl->backend->server_cert = pXVar6;
    if (connssl->backend->server_cert == (X509 *)0x0) {
      BIO_free(a);
      BIO_free(fp_00);
      if (strict) {
        Curl_failf(data_00,"SSL: couldn\'t get peer certificate!");
        conn_local._4_4_ = CURLE_PEER_FAILED_VERIFICATION;
      }
      else {
        conn_local._4_4_ = CURLE_OK;
      }
    }
    else {
      bVar10 = false;
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        bVar10 = conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete;
      }
      pcVar5 = "Server";
      if (bVar10) {
        pcVar5 = "Proxy";
      }
      Curl_infof(data_00,"%s certificate:\n",pcVar5);
      pXVar7 = X509_get_subject_name((X509 *)connssl->backend->server_cert);
      iVar3 = x509_name_oneline((X509_NAME *)pXVar7,(char *)&ptr,0x800);
      if (iVar3 == 0) {
        local_9a8 = &ptr;
      }
      else {
        local_9a8 = (char **)0x78b86d;
      }
      Curl_infof(data_00," subject: %s\n",local_9a8);
      pAVar8 = (ASN1_TIME *)X509_get0_notBefore(connssl->backend->server_cert);
      ASN1_TIME_print(fp_00,pAVar8);
      lVar9 = BIO_ctrl(fp_00,3,0,&certverifyresult);
      Curl_infof(data_00," start date: %.*s\n",lVar9,certverifyresult);
      BIO_ctrl(fp_00,1,0,(void *)0x0);
      pAVar8 = (ASN1_TIME *)X509_get0_notAfter(connssl->backend->server_cert);
      ASN1_TIME_print(fp_00,pAVar8);
      lVar9 = BIO_ctrl(fp_00,3,0,&certverifyresult);
      Curl_infof(data_00," expire date: %.*s\n",lVar9,certverifyresult);
      BIO_ctrl(fp_00,1,0,(void *)0x0);
      BIO_free(fp_00);
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
        bVar1 = (conn->proxy_ssl_config).verifyhost;
      }
      else {
        bVar1 = (conn->ssl_config).verifyhost;
      }
      if (((bVar1 & 1) == 0) ||
         (local_28 = verifyhost(conn,connssl->backend->server_cert), local_28 == CURLE_OK)) {
        pXVar7 = X509_get_issuer_name((X509 *)connssl->backend->server_cert);
        iVar3 = x509_name_oneline((X509_NAME *)pXVar7,(char *)&ptr,0x800);
        if (iVar3 == 0) {
          Curl_infof(data_00," issuer: %s\n",&ptr);
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
            pcVar5 = (data_00->set).proxy_ssl.issuercert;
          }
          else {
            pcVar5 = (data_00->set).ssl.issuercert;
          }
          if (pcVar5 != (char *)0x0) {
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete))
            {
              local_9c8 = (data_00->set).proxy_ssl.issuercert;
            }
            else {
              local_9c8 = (data_00->set).ssl.issuercert;
            }
            lVar9 = BIO_ctrl(a,0x6c,3,local_9c8);
            if ((int)lVar9 < 1) {
              if (strict) {
                if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
                   (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state !=
                    ssl_connection_complete)) {
                  local_9d8 = (data_00->set).proxy_ssl.issuercert;
                }
                else {
                  local_9d8 = (data_00->set).ssl.issuercert;
                }
                Curl_failf(data_00,"SSL: Unable to open issuer cert (%s)",local_9d8);
              }
              BIO_free(a);
              X509_free((X509 *)connssl->backend->server_cert);
              connssl->backend->server_cert = (X509 *)0x0;
              return CURLE_SSL_ISSUER_ERROR;
            }
            issuer_00 = PEM_read_bio_X509(a,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
            if (issuer_00 == (X509 *)0x0) {
              if (strict) {
                if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
                   (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state !=
                    ssl_connection_complete)) {
                  local_9e8 = (data_00->set).proxy_ssl.issuercert;
                }
                else {
                  local_9e8 = (data_00->set).ssl.issuercert;
                }
                Curl_failf(data_00,"SSL: Unable to read issuer cert (%s)",local_9e8);
              }
              BIO_free(a);
              X509_free((X509 *)0x0);
              X509_free((X509 *)connssl->backend->server_cert);
              connssl->backend->server_cert = (X509 *)0x0;
              return CURLE_SSL_ISSUER_ERROR;
            }
            iVar3 = X509_check_issued(issuer_00,(X509 *)connssl->backend->server_cert);
            if (iVar3 != 0) {
              if (strict) {
                if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
                   (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state !=
                    ssl_connection_complete)) {
                  local_9f8 = (data_00->set).proxy_ssl.issuercert;
                }
                else {
                  local_9f8 = (data_00->set).ssl.issuercert;
                }
                Curl_failf(data_00,"SSL: Certificate issuer check failed (%s)",local_9f8);
              }
              BIO_free(a);
              X509_free(issuer_00);
              X509_free((X509 *)connssl->backend->server_cert);
              connssl->backend->server_cert = (X509 *)0x0;
              return CURLE_SSL_ISSUER_ERROR;
            }
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete))
            {
              local_a08 = (data_00->set).proxy_ssl.issuercert;
            }
            else {
              local_a08 = (data_00->set).ssl.issuercert;
            }
            Curl_infof(data_00," SSL certificate issuer check ok (%s)\n",local_a08);
            X509_free(issuer_00);
          }
          lVar9 = SSL_get_verify_result((SSL *)connssl->backend->handle);
          *local_980 = lVar9;
          if (*local_980 == 0) {
            Curl_infof(data_00," SSL certificate verify ok.\n");
          }
          else {
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete))
            {
              bVar1 = (conn->proxy_ssl_config).verifypeer;
            }
            else {
              bVar1 = (conn->ssl_config).verifypeer;
            }
            if ((bVar1 & 1) == 0) {
              pcVar5 = X509_verify_cert_error_string(lVar9);
              Curl_infof(data_00," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                         pcVar5,lVar9);
            }
            else {
              if (strict) {
                pcVar5 = X509_verify_cert_error_string(lVar9);
                Curl_failf(data_00,"SSL certificate verify result: %s (%ld)",pcVar5,lVar9);
              }
              local_28 = CURLE_PEER_FAILED_VERIFICATION;
            }
          }
        }
        else {
          if (strict) {
            Curl_failf(data_00,"SSL: couldn\'t get X509-issuer name!");
          }
          local_28 = CURLE_PEER_FAILED_VERIFICATION;
        }
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
          bVar1 = (conn->proxy_ssl_config).verifystatus;
        }
        else {
          bVar1 = (conn->ssl_config).verifystatus;
        }
        if (((bVar1 & 1) == 0) || (local_28 = verifystatus(conn,connssl), local_28 == CURLE_OK)) {
          if (!strict) {
            local_28 = CURLE_OK;
          }
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
            local_a20 = (long *)(data_00->set).str[0x1f];
          }
          else {
            local_a20 = (long *)(data_00->set).str[0x1e];
          }
          certverifyresult = local_a20;
          if (((local_28 == CURLE_OK) && (local_a20 != (long *)0x0)) &&
             (local_28 = pkp_pin_peer_pubkey(data_00,connssl->backend->server_cert,(char *)local_a20
                                            ), local_28 != CURLE_OK)) {
            Curl_failf(data_00,"SSL: public key does not match pinned public key!");
          }
          BIO_free(a);
          X509_free((X509 *)connssl->backend->server_cert);
          connssl->backend->server_cert = (X509 *)0x0;
          connssl->connecting_state = ssl_connect_done;
          conn_local._4_4_ = local_28;
        }
        else {
          BIO_free(a);
          X509_free((X509 *)connssl->backend->server_cert);
          connssl->backend->server_cert = (X509 *)0x0;
          conn_local._4_4_ = local_28;
        }
      }
      else {
        BIO_free(a);
        X509_free((X509 *)connssl->backend->server_cert);
        connssl->backend->server_cert = (X509 *)0x0;
        conn_local._4_4_ = local_28;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode servercert(struct connectdata *conn,
                           struct ssl_connect_data *connssl,
                           bool strict)
{
  CURLcode result = CURLE_OK;
  int rc;
  long lerr;
  struct Curl_easy *data = conn->data;
  X509 *issuer;
  BIO *fp = NULL;
  char error_buffer[256]="";
  char buffer[2048];
  const char *ptr;
  long * const certverifyresult = SSL_IS_PROXY() ?
    &data->set.proxy_ssl.certverifyresult : &data->set.ssl.certverifyresult;
  BIO *mem = BIO_new(BIO_s_mem());

  if(data->set.ssl.certinfo)
    /* we've been asked to gather certificate info! */
    (void)get_cert_chain(conn, connssl);

  fp = BIO_new(BIO_s_file());
  if(fp == NULL) {
    failf(data,
          "BIO_new return NULL, " OSSL_PACKAGE
          " error %s",
          ossl_strerror(ERR_get_error(), error_buffer,
                        sizeof(error_buffer)) );
    BIO_free(mem);
    return CURLE_OUT_OF_MEMORY;
  }

  BACKEND->server_cert = SSL_get_peer_certificate(BACKEND->handle);
  if(!BACKEND->server_cert) {
    BIO_free(fp);
    BIO_free(mem);
    if(!strict)
      return CURLE_OK;

    failf(data, "SSL: couldn't get peer certificate!");
    return CURLE_PEER_FAILED_VERIFICATION;
  }

  infof(data, "%s certificate:\n", SSL_IS_PROXY() ? "Proxy" : "Server");

  rc = x509_name_oneline(X509_get_subject_name(BACKEND->server_cert),
                         buffer, sizeof(buffer));
  infof(data, " subject: %s\n", rc?"[NONE]":buffer);

#ifndef CURL_DISABLE_VERBOSE_STRINGS
  {
    long len;
    ASN1_TIME_print(mem, X509_get0_notBefore(BACKEND->server_cert));
    len = BIO_get_mem_data(mem, (char **) &ptr);
    infof(data, " start date: %.*s\n", len, ptr);
    (void)BIO_reset(mem);

    ASN1_TIME_print(mem, X509_get0_notAfter(BACKEND->server_cert));
    len = BIO_get_mem_data(mem, (char **) &ptr);
    infof(data, " expire date: %.*s\n", len, ptr);
    (void)BIO_reset(mem);
  }
#endif

  BIO_free(mem);

  if(SSL_CONN_CONFIG(verifyhost)) {
    result = verifyhost(conn, BACKEND->server_cert);
    if(result) {
      BIO_free(fp);
      X509_free(BACKEND->server_cert);
      BACKEND->server_cert = NULL;
      return result;
    }
  }

  rc = x509_name_oneline(X509_get_issuer_name(BACKEND->server_cert),
                         buffer, sizeof(buffer));
  if(rc) {
    if(strict)
      failf(data, "SSL: couldn't get X509-issuer name!");
    result = CURLE_PEER_FAILED_VERIFICATION;
  }
  else {
    infof(data, " issuer: %s\n", buffer);

    /* We could do all sorts of certificate verification stuff here before
       deallocating the certificate. */

    /* e.g. match issuer name with provided issuer certificate */
    if(SSL_SET_OPTION(issuercert)) {
      if(BIO_read_filename(fp, SSL_SET_OPTION(issuercert)) <= 0) {
        if(strict)
          failf(data, "SSL: Unable to open issuer cert (%s)",
                SSL_SET_OPTION(issuercert));
        BIO_free(fp);
        X509_free(BACKEND->server_cert);
        BACKEND->server_cert = NULL;
        return CURLE_SSL_ISSUER_ERROR;
      }

      issuer = PEM_read_bio_X509(fp, NULL, ZERO_NULL, NULL);
      if(!issuer) {
        if(strict)
          failf(data, "SSL: Unable to read issuer cert (%s)",
                SSL_SET_OPTION(issuercert));
        BIO_free(fp);
        X509_free(issuer);
        X509_free(BACKEND->server_cert);
        BACKEND->server_cert = NULL;
        return CURLE_SSL_ISSUER_ERROR;
      }

      if(X509_check_issued(issuer, BACKEND->server_cert) != X509_V_OK) {
        if(strict)
          failf(data, "SSL: Certificate issuer check failed (%s)",
                SSL_SET_OPTION(issuercert));
        BIO_free(fp);
        X509_free(issuer);
        X509_free(BACKEND->server_cert);
        BACKEND->server_cert = NULL;
        return CURLE_SSL_ISSUER_ERROR;
      }

      infof(data, " SSL certificate issuer check ok (%s)\n",
            SSL_SET_OPTION(issuercert));
      X509_free(issuer);
    }

    lerr = *certverifyresult = SSL_get_verify_result(BACKEND->handle);

    if(*certverifyresult != X509_V_OK) {
      if(SSL_CONN_CONFIG(verifypeer)) {
        /* We probably never reach this, because SSL_connect() will fail
           and we return earlier if verifypeer is set? */
        if(strict)
          failf(data, "SSL certificate verify result: %s (%ld)",
                X509_verify_cert_error_string(lerr), lerr);
        result = CURLE_PEER_FAILED_VERIFICATION;
      }
      else
        infof(data, " SSL certificate verify result: %s (%ld),"
              " continuing anyway.\n",
              X509_verify_cert_error_string(lerr), lerr);
    }
    else
      infof(data, " SSL certificate verify ok.\n");
  }

#if (OPENSSL_VERSION_NUMBER >= 0x0090808fL) && !defined(OPENSSL_NO_TLSEXT) && \
    !defined(OPENSSL_NO_OCSP)
  if(SSL_CONN_CONFIG(verifystatus)) {
    result = verifystatus(conn, connssl);
    if(result) {
      BIO_free(fp);
      X509_free(BACKEND->server_cert);
      BACKEND->server_cert = NULL;
      return result;
    }
  }
#endif

  if(!strict)
    /* when not strict, we don't bother about the verify cert problems */
    result = CURLE_OK;

  ptr = SSL_IS_PROXY() ? data->set.str[STRING_SSL_PINNEDPUBLICKEY_PROXY] :
                         data->set.str[STRING_SSL_PINNEDPUBLICKEY_ORIG];
  if(!result && ptr) {
    result = pkp_pin_peer_pubkey(data, BACKEND->server_cert, ptr);
    if(result)
      failf(data, "SSL: public key does not match pinned public key!");
  }

  BIO_free(fp);
  X509_free(BACKEND->server_cert);
  BACKEND->server_cert = NULL;
  connssl->connecting_state = ssl_connect_done;

  return result;
}